

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O0

int ply_read_header_property(p_ply ply)

{
  int iVar1;
  e_ply_type eVar2;
  p_ply_property_conflict __dest;
  p_ply_property_conflict property;
  p_ply_element_conflict element;
  p_ply ply_local;
  
  iVar1 = strcmp(ply->buffer + ply->buffer_token,"property");
  if (iVar1 == 0) {
    __dest = ply_grow_property(ply,ply->element + ply->nelements + -1);
    if (__dest == (p_ply_property_conflict)0x0) {
      ply_local._4_4_ = 0;
    }
    else {
      iVar1 = ply_read_word(ply);
      if (iVar1 == 0) {
        ply_local._4_4_ = 0;
      }
      else {
        eVar2 = ply_find_string(ply->buffer + ply->buffer_token,ply_type_list);
        __dest->type = eVar2;
        if (__dest->type == ~PLY_INT8) {
          ply_local._4_4_ = 0;
        }
        else {
          if (__dest->type == PLY_LIST) {
            iVar1 = ply_read_word(ply);
            if (iVar1 == 0) {
              return 0;
            }
            eVar2 = ply_find_string(ply->buffer + ply->buffer_token,ply_type_list);
            __dest->length_type = eVar2;
            if (__dest->length_type == ~PLY_INT8) {
              return 0;
            }
            iVar1 = ply_read_word(ply);
            if (iVar1 == 0) {
              return 0;
            }
            eVar2 = ply_find_string(ply->buffer + ply->buffer_token,ply_type_list);
            __dest->value_type = eVar2;
            if (__dest->value_type == ~PLY_INT8) {
              return 0;
            }
          }
          iVar1 = ply_read_word(ply);
          if (iVar1 == 0) {
            ply_local._4_4_ = 0;
          }
          else {
            strcpy(__dest->name,ply->buffer + ply->buffer_token);
            iVar1 = ply_read_word(ply);
            if (iVar1 == 0) {
              ply_local._4_4_ = 0;
            }
            else {
              ply_local._4_4_ = 1;
            }
          }
        }
      }
    }
  }
  else {
    ply_local._4_4_ = 0;
  }
  return ply_local._4_4_;
}

Assistant:

static int ply_read_header_property(p_ply ply) {
    p_ply_element element = NULL;
    p_ply_property property = NULL;
    /* make sure it is a property */
    if (strcmp(BWORD(ply), "property")) return 0;
    element = &ply->element[ply->nelements-1];
    property = ply_grow_property(ply, element);
    if (!property) return 0;
    /* get property type */
    if (!ply_read_word(ply)) return 0;
    property->type = ply_find_string(BWORD(ply), ply_type_list);
    if (property->type == (e_ply_type) (-1)) return 0;
    if (property->type == PLY_LIST) {
        /* if it's a list, we need the base types */
        if (!ply_read_word(ply)) return 0;
        property->length_type = ply_find_string(BWORD(ply), ply_type_list);
        if (property->length_type == (e_ply_type) (-1)) return 0;
        if (!ply_read_word(ply)) return 0;
        property->value_type = ply_find_string(BWORD(ply), ply_type_list);
        if (property->value_type == (e_ply_type) (-1)) return 0;
    }
    /* get property name */
    if (!ply_read_word(ply)) return 0;
    strcpy(property->name, BWORD(ply));
    if (!ply_read_word(ply)) return 0;
    return 1;
}